

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O2

int Kit_SopAnyLiteral(Kit_Sop_t *cSop,int nLits)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = 0;
  if (nLits < 1) {
    nLits = 0;
  }
  while( true ) {
    if (uVar1 == nLits) {
      return -1;
    }
    uVar3 = 0;
    uVar2 = (ulong)(uint)cSop->nCubes;
    if (cSop->nCubes < 1) {
      uVar2 = uVar3;
    }
    uVar4 = 0;
    for (; (uVar2 != uVar3 && (cSop->pCubes[uVar3] != 0)); uVar3 = uVar3 + 1) {
      uVar4 = uVar4 + ((cSop->pCubes[uVar3] >> (uVar1 & 0x1f) & 1) != 0);
    }
    if (1 < uVar4) break;
    uVar1 = uVar1 + 1;
  }
  return uVar1;
}

Assistant:

int Kit_SopAnyLiteral( Kit_Sop_t * cSop, int nLits )
{
    unsigned uCube;
    int i, k, nLitsCur;
    // go through each literal
    for ( i = 0; i < nLits; i++ )
    {
        // go through all the cubes
        nLitsCur = 0;
        Kit_SopForEachCube( cSop, uCube, k )
            if ( Kit_CubeHasLit(uCube, i) )
                nLitsCur++;
        if ( nLitsCur > 1 )
            return i;
    }
    return -1;
}